

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

bool __thiscall
cmListFile::ParseString
          (cmListFile *this,char *str,char *virtual_filename,cmMessenger *messenger,
          cmListFileBacktrace *lfbt)

{
  bool bVar1;
  cmListFileParser parser;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  _Stack_b8;
  cmListFileParser local_a8;
  
  std::
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&_Stack_b8,
                 (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  *)lfbt);
  cmListFileParser::cmListFileParser(&local_a8,this,(cmListFileBacktrace *)&_Stack_b8,messenger);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_b8._M_refcount);
  bVar1 = cmListFileParser::ParseString(&local_a8,str,virtual_filename);
  cmListFileParser::~cmListFileParser(&local_a8);
  return bVar1;
}

Assistant:

bool cmListFile::ParseString(const char* str, const char* virtual_filename,
                             cmMessenger* messenger,
                             const cmListFileBacktrace& lfbt)
{
  bool parseError = false;

  {
    cmListFileParser parser(this, lfbt, messenger);
    parseError = !parser.ParseString(str, virtual_filename);
  }

  return !parseError;
}